

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O0

int CVodeGetNumStabLimOrderReds(void *cvode_mem,long *nslred)

{
  undefined8 *in_RSI;
  long in_RDI;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeGetNumStabLimOrderReds",
                   "cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    if (*(int *)(in_RDI + 0x498) == 0) {
      *in_RSI = 0;
    }
    else {
      *in_RSI = *(undefined8 *)(in_RDI + 0x568);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeGetNumStabLimOrderReds(void *cvode_mem, long int *nslred)
{
  CVodeMem cv_mem;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeGetNumStabLimOrderReds", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  if (cv_mem->cv_sldeton==SUNFALSE)
    *nslred = 0;
  else
    *nslred = cv_mem->cv_nor;

  return(CV_SUCCESS);
}